

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O3

QFormDataPartBuilder __thiscall
QFormDataPartBuilder::setBodyHelper
          (QFormDataPartBuilder *this,QByteArray *data,QAnyStringView name,QAnyStringView mimeType)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QFormDataPartBuilderPrivate *pQVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func(this);
  QVar5.m_size = (size_t)name.field_0.m_data;
  QVar5.field_0.m_data = &local_58;
  QtPrivate::convertToQString(QVar5);
  pQVar1 = &((pQVar4->m_originalBodyName).d.d)->super_QArrayData;
  pcVar2 = (pQVar4->m_originalBodyName).d.ptr;
  (pQVar4->m_originalBodyName).d.d = (Data *)local_58;
  (pQVar4->m_originalBodyName).d.ptr = pcStack_50;
  qVar3 = (pQVar4->m_originalBodyName).d.size;
  (pQVar4->m_originalBodyName).d.size = local_48;
  local_58 = pQVar1;
  pcStack_50 = pcVar2;
  local_48 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  convertInto(&pQVar4->m_mimeType,mimeType);
  std::variant<QIODevice*,QByteArray>::operator=
            ((variant<QIODevice*,QByteArray> *)&pQVar4->m_body,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *this;
  }
  __stack_chk_fail();
}

Assistant:

QFormDataPartBuilder QFormDataPartBuilder::setBodyHelper(const QByteArray &data,
                                                         QAnyStringView name,
                                                         QAnyStringView mimeType)
{
    Q_D(QFormDataPartBuilder);

    d->m_originalBodyName = name.toString();
    convertInto(d->m_mimeType, mimeType);
    d->m_body = data;
    return *this;
}